

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::instruction_to_result_type
          (Compiler *this,uint32_t *result_type,uint32_t *result_id,Op op,uint32_t *args,
          uint32_t length)

{
  bool has_result_type;
  bool has_result_id;
  bool local_2a;
  bool local_29;
  
  if (1 < length) {
    local_29 = false;
    local_2a = false;
    spv::HasResultAndType(op,&local_29,&local_2a);
    if (local_29 != true) {
      return false;
    }
    if (local_2a == true) {
      *result_type = *args;
      *result_id = args[1];
      return true;
    }
  }
  return false;
}

Assistant:

bool Compiler::instruction_to_result_type(uint32_t &result_type, uint32_t &result_id, spv::Op op,
                                          const uint32_t *args, uint32_t length)
{
	if (length < 2)
		return false;

	bool has_result_id = false, has_result_type = false;
	HasResultAndType(op, &has_result_id, &has_result_type);
	if (has_result_id && has_result_type)
	{
		result_type = args[0];
		result_id = args[1];
		return true;
	}
	else
		return false;
}